

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_unittests.cpp
# Opt level: O0

void __thiscall Matrix_Add_Test::TestBody(Matrix_Add_Test *this)

{
  bool bVar1;
  int *piVar2;
  char *pcVar3;
  AssertHelper local_1d8;
  Message local_1d0;
  int local_1c4;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_8;
  Message local_1a8;
  int local_19c;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_7;
  Message local_180;
  int local_174;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_6;
  Message local_158;
  int local_14c;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_5;
  Message local_130;
  int local_124;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_4;
  Message local_108;
  int local_fc;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_3;
  Message local_e0;
  int local_d4;
  size_t local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_b0;
  Message local_a8;
  int local_9c;
  size_t local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_1;
  Message local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  Matrix<int> s2;
  Matrix<int> s;
  Matrix<int> c;
  undefined1 local_20 [8];
  Matrix<int> m;
  Matrix_Add_Test *this_local;
  
  m.M = (int **)this;
  Matrix<int>::Matrix((Matrix<int> *)local_20,2,3);
  piVar2 = Matrix<int>::operator[]((Matrix<int> *)local_20,0);
  *piVar2 = 1;
  piVar2 = Matrix<int>::operator[]((Matrix<int> *)local_20,0);
  piVar2[1] = 2;
  piVar2 = Matrix<int>::operator[]((Matrix<int> *)local_20,1);
  *piVar2 = 3;
  piVar2 = Matrix<int>::operator[]((Matrix<int> *)local_20,1);
  piVar2[1] = 4;
  Matrix<int>::Matrix((Matrix<int> *)&s.M,(Matrix<int> *)local_20);
  Matrix<int>::operator+((Matrix<int> *)&s2.M,(Matrix<int> *)local_20);
  Matrix<int>::operator+((Matrix<int> *)&gtest_ar.message_,(Matrix<int> *)&s.M);
  testing::internal::EqHelper<false>::Compare<Matrix<int>,Matrix<int>>
            ((EqHelper<false> *)local_70,"s2","s",(Matrix<int> *)&gtest_ar.message_,
             (Matrix<int> *)&s2.M);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/BMSTU-2019-LAB[P]02-lab-04-templates-matrix-AntonGrigorev/tests/matrix_unittests.cpp"
               ,0x2e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  local_98 = Matrix<int>::get_rows((Matrix<int> *)&s2.M);
  local_9c = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_90,"s.get_rows()","2",&local_98,&local_9c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/BMSTU-2019-LAB[P]02-lab-04-templates-matrix-AntonGrigorev/tests/matrix_unittests.cpp"
               ,0x30,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    testing::Message::~Message(&local_a8);
  }
  gtest_ar_2.message_.ptr_._5_3_ = 0;
  gtest_ar_2.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  if (gtest_ar_2.message_.ptr_._4_4_ == 0) {
    local_d0 = Matrix<int>::get_columns((Matrix<int> *)&s2.M);
    local_d4 = 3;
    testing::internal::EqHelper<false>::Compare<unsigned_long,int>
              ((EqHelper<false> *)local_c8,"s.get_columns()","3",&local_d0,&local_d4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
    if (!bVar1) {
      testing::Message::Message(&local_e0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/BMSTU-2019-LAB[P]02-lab-04-templates-matrix-AntonGrigorev/tests/matrix_unittests.cpp"
                 ,0x31,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_e0);
    }
    gtest_ar_2.message_.ptr_._5_3_ = 0;
    gtest_ar_2.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
    if (gtest_ar_2.message_.ptr_._4_4_ == 0) {
      piVar2 = Matrix<int>::operator[]((Matrix<int> *)&s2.M,0);
      local_fc = 2;
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_f8,"s[0][0]","2",piVar2,&local_fc);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
      if (!bVar1) {
        testing::Message::Message(&local_108);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/BMSTU-2019-LAB[P]02-lab-04-templates-matrix-AntonGrigorev/tests/matrix_unittests.cpp"
                   ,0x32,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_108);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
        testing::Message::~Message(&local_108);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
      piVar2 = Matrix<int>::operator[]((Matrix<int> *)&s2.M,0);
      local_124 = 4;
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_120,"s[0][1]","4",piVar2 + 1,&local_124);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
      if (!bVar1) {
        testing::Message::Message(&local_130);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/BMSTU-2019-LAB[P]02-lab-04-templates-matrix-AntonGrigorev/tests/matrix_unittests.cpp"
                   ,0x33,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_130);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
        testing::Message::~Message(&local_130);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
      piVar2 = Matrix<int>::operator[]((Matrix<int> *)&s2.M,1);
      local_14c = 6;
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_148,"s[1][0]","6",piVar2,&local_14c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
      if (!bVar1) {
        testing::Message::Message(&local_158);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/BMSTU-2019-LAB[P]02-lab-04-templates-matrix-AntonGrigorev/tests/matrix_unittests.cpp"
                   ,0x34,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_158);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
        testing::Message::~Message(&local_158);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
      piVar2 = Matrix<int>::operator[]((Matrix<int> *)&s2.M,1);
      local_174 = 8;
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_170,"s[1][1]","8",piVar2 + 1,&local_174);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
      if (!bVar1) {
        testing::Message::Message(&local_180);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/BMSTU-2019-LAB[P]02-lab-04-templates-matrix-AntonGrigorev/tests/matrix_unittests.cpp"
                   ,0x35,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_180);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
        testing::Message::~Message(&local_180);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
      piVar2 = Matrix<int>::operator[]((Matrix<int> *)&s2.M,0);
      local_19c = 0;
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_198,"s[0][2]","0",piVar2 + 2,&local_19c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
      if (!bVar1) {
        testing::Message::Message(&local_1a8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/BMSTU-2019-LAB[P]02-lab-04-templates-matrix-AntonGrigorev/tests/matrix_unittests.cpp"
                   ,0x36,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_1a8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
        testing::Message::~Message(&local_1a8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
      piVar2 = Matrix<int>::operator[]((Matrix<int> *)&s2.M,1);
      local_1c4 = 0;
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_1c0,"s[1][2]","0",piVar2 + 2,&local_1c4);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
      if (!bVar1) {
        testing::Message::Message(&local_1d0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/BMSTU-2019-LAB[P]02-lab-04-templates-matrix-AntonGrigorev/tests/matrix_unittests.cpp"
                   ,0x37,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
        testing::internal::AssertHelper::~AssertHelper(&local_1d8);
        testing::Message::~Message(&local_1d0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
      gtest_ar_2.message_.ptr_._4_4_ = 0;
    }
  }
  Matrix<int>::~Matrix((Matrix<int> *)&gtest_ar.message_);
  Matrix<int>::~Matrix((Matrix<int> *)&s2.M);
  Matrix<int>::~Matrix((Matrix<int> *)&s.M);
  Matrix<int>::~Matrix((Matrix<int> *)local_20);
  return;
}

Assistant:

TEST(Matrix, Add) {
  Matrix<int> m(2, 3);
  m[0][0] = 1;
  m[0][1] = 2;
  m[1][0] = 3;
  m[1][1] = 4;

  Matrix<int> c = m;

  Matrix<int> s = m + c;
  Matrix<int> s2 = c + c;
  EXPECT_EQ(s2, s);

  ASSERT_EQ(s.get_rows(), 2);
  ASSERT_EQ(s.get_columns(), 3);
  EXPECT_EQ(s[0][0], 2);
  EXPECT_EQ(s[0][1], 4);
  EXPECT_EQ(s[1][0], 6);
  EXPECT_EQ(s[1][1], 8);
  EXPECT_EQ(s[0][2], 0);
  EXPECT_EQ(s[1][2], 0);
}